

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyAuxRef.h
# Opt level: O1

ChFrame<double> * __thiscall
chrono::ChBodyAuxRef::GetFrame_COG_to_REF
          (ChFrame<double> *__return_storage_ptr__,ChBodyAuxRef *this)

{
  ChFrameMoving<double> tmp;
  ChFrameMoving<double> local_110;
  
  local_110.super_ChFrame<double>.coord.pos.m_data[0] =
       (this->auxref_to_cog).super_ChFrame<double>.coord.pos.m_data[0];
  local_110.super_ChFrame<double>.coord.pos.m_data[1] =
       (this->auxref_to_cog).super_ChFrame<double>.coord.pos.m_data[1];
  local_110.super_ChFrame<double>.coord.pos.m_data[2] =
       (this->auxref_to_cog).super_ChFrame<double>.coord.pos.m_data[2];
  local_110.super_ChFrame<double>.coord.rot.m_data[0] =
       (this->auxref_to_cog).super_ChFrame<double>.coord.rot.m_data[0];
  local_110.super_ChFrame<double>.coord.rot.m_data[1] =
       (this->auxref_to_cog).super_ChFrame<double>.coord.rot.m_data[1];
  local_110.super_ChFrame<double>.coord.rot.m_data[2] =
       (this->auxref_to_cog).super_ChFrame<double>.coord.rot.m_data[2];
  local_110.super_ChFrame<double>.coord.rot.m_data[3] =
       (this->auxref_to_cog).super_ChFrame<double>.coord.rot.m_data[3];
  local_110.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (this->auxref_to_cog).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_110.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       *(double *)
        ((long)&(this->auxref_to_cog).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  local_110.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       *(double *)
        ((long)&(this->auxref_to_cog).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  local_110.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       *(double *)
        ((long)&(this->auxref_to_cog).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  local_110.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       *(double *)
        ((long)&(this->auxref_to_cog).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x20
        );
  local_110.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       *(double *)
        ((long)&(this->auxref_to_cog).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  local_110.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       *(double *)
        ((long)&(this->auxref_to_cog).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  local_110.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       *(double *)
        ((long)&(this->auxref_to_cog).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  local_110.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       *(double *)
        ((long)&(this->auxref_to_cog).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  local_110.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b278;
  local_110.coord_dt.pos.m_data[0] = (this->auxref_to_cog).coord_dt.pos.m_data[0];
  local_110.coord_dt.pos.m_data[1] = (this->auxref_to_cog).coord_dt.pos.m_data[1];
  local_110.coord_dt.pos.m_data[2] = (this->auxref_to_cog).coord_dt.pos.m_data[2];
  local_110.coord_dt.rot.m_data[0] = (this->auxref_to_cog).coord_dt.rot.m_data[0];
  local_110.coord_dt.rot.m_data[1] = (this->auxref_to_cog).coord_dt.rot.m_data[1];
  local_110.coord_dt.rot.m_data[2] = (this->auxref_to_cog).coord_dt.rot.m_data[2];
  local_110.coord_dt.rot.m_data[3] = (this->auxref_to_cog).coord_dt.rot.m_data[3];
  local_110.coord_dtdt.pos.m_data[0] = (this->auxref_to_cog).coord_dtdt.pos.m_data[0];
  local_110.coord_dtdt.pos.m_data[1] = (this->auxref_to_cog).coord_dtdt.pos.m_data[1];
  local_110.coord_dtdt.pos.m_data[2] = (this->auxref_to_cog).coord_dtdt.pos.m_data[2];
  local_110.coord_dtdt.rot.m_data[0] = (this->auxref_to_cog).coord_dtdt.rot.m_data[0];
  local_110.coord_dtdt.rot.m_data[1] = (this->auxref_to_cog).coord_dtdt.rot.m_data[1];
  local_110.coord_dtdt.rot.m_data[2] = (this->auxref_to_cog).coord_dtdt.rot.m_data[2];
  local_110.coord_dtdt.rot.m_data[3] = (this->auxref_to_cog).coord_dtdt.rot.m_data[3];
  ChFrameMoving<double>::Invert(&local_110);
  __return_storage_ptr__->_vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  (__return_storage_ptr__->coord).pos.m_data[0] =
       local_110.super_ChFrame<double>.coord.pos.m_data[0];
  (__return_storage_ptr__->coord).pos.m_data[1] =
       local_110.super_ChFrame<double>.coord.pos.m_data[1];
  (__return_storage_ptr__->coord).pos.m_data[2] =
       local_110.super_ChFrame<double>.coord.pos.m_data[2];
  (__return_storage_ptr__->coord).rot.m_data[0] =
       local_110.super_ChFrame<double>.coord.rot.m_data[0];
  (__return_storage_ptr__->coord).rot.m_data[1] =
       local_110.super_ChFrame<double>.coord.rot.m_data[1];
  (__return_storage_ptr__->coord).rot.m_data[2] =
       local_110.super_ChFrame<double>.coord.rot.m_data[2];
  (__return_storage_ptr__->coord).rot.m_data[3] =
       local_110.super_ChFrame<double>.coord.rot.m_data[3];
  (__return_storage_ptr__->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_110.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  (__return_storage_ptr__->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_110.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  (__return_storage_ptr__->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_110.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  (__return_storage_ptr__->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_110.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  (__return_storage_ptr__->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_110.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  (__return_storage_ptr__->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_110.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  (__return_storage_ptr__->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_110.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  (__return_storage_ptr__->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_110.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  (__return_storage_ptr__->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_110.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  return __return_storage_ptr__;
}

Assistant:

ChFrame<> GetFrame_COG_to_REF() const { return auxref_to_cog.GetInverse(); }